

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O1

QCGroup * __thiscall
obx::anon_unknown_3::QCGroup::copyThisAndPush
          (QCGroup *__return_storage_ptr__,QCGroup *this,QueryCondition *other)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<obx::(anonymous_namespace)::QueryCondition> *__cur;
  pointer psVar4;
  ulong uVar5;
  pointer psVar6;
  pointer psVar7;
  ulong uVar8;
  pointer psVar9;
  _Head_base<0UL,_obx::(anonymous_namespace)::QueryCondition_*,_false> *__r;
  long lVar10;
  _Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
  *this_00;
  shared_ptr<obx::(anonymous_namespace)::QueryCondition> local_48;
  _Head_base<0UL,_obx::(anonymous_namespace)::QueryCondition_*,_false> local_38;
  
  (__return_storage_ptr__->super_QueryCondition)._vptr_QueryCondition =
       (_func_int **)&PTR__QCGroup_00112910;
  __return_storage_ptr__->isOr_ = this->isOr_;
  lVar10 = (long)(this->conditions_).
                 super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->conditions_).
                 super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->conditions_).
  super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->conditions_).
  super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->conditions_).
  super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar4 = std::
           _Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
           ::_M_allocate((_Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                          *)(lVar10 >> 4),(size_t)this);
  (__return_storage_ptr__->conditions_).
  super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
  ._M_impl.super__Vector_impl_data._M_start = psVar4;
  (__return_storage_ptr__->conditions_).
  super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar4;
  (__return_storage_ptr__->conditions_).
  super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar10 + (long)psVar4);
  psVar1 = (this->conditions_).
           super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar7 = (this->conditions_).
                super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar1; psVar7 = psVar7 + 1) {
    (psVar4->
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
    _M_ptr = (psVar7->
             super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    p_Var2 = (psVar7->
             super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
             )._M_refcount._M_pi;
    (psVar4->
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    psVar4 = psVar4 + 1;
  }
  (__return_storage_ptr__->conditions_).
  super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar4;
  (*other->_vptr_QueryCondition[5])(&local_38,other);
  __r = &local_38;
  std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>::
  shared_ptr<obx::(anonymous_namespace)::QueryCondition,std::default_delete<obx::(anonymous_namespace)::QueryCondition>,void>
            (&local_48,
             (unique_ptr<obx::(anonymous_namespace)::QueryCondition,_std::default_delete<obx::(anonymous_namespace)::QueryCondition>_>
              *)__r);
  _Var3._M_pi = local_48.
                super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  psVar7 = (__return_storage_ptr__->conditions_).
           super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar7 == (__return_storage_ptr__->conditions_).
                super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    psVar1 = (__return_storage_ptr__->conditions_).
             super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar10 = (long)psVar7 - (long)psVar1;
    if (lVar10 == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar5 = lVar10 >> 4;
    uVar8 = 1;
    if (psVar7 != psVar1) {
      uVar8 = uVar5;
    }
    this_00 = (_Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
               *)(uVar8 + uVar5);
    if ((_Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
         *)0x7fffffffffffffe < this_00) {
      this_00 = (_Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                 *)0x7ffffffffffffff;
    }
    if (CARRY8(uVar8,uVar5)) {
      this_00 = (_Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                 *)0x7ffffffffffffff;
    }
    psVar6 = std::
             _Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
             ::_M_allocate(this_00,(size_t)__r);
    _Var3._M_pi = local_48.
                  super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    *(element_type **)((long)psVar6 + lVar10) =
         local_48.
         super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    *(undefined8 *)((long)psVar6 + lVar10 + 8) = 0;
    local_48.
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)psVar6 + lVar10 + 8) = _Var3._M_pi;
    local_48.
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    psVar9 = psVar6;
    for (psVar4 = psVar1; psVar7 != psVar4; psVar4 = psVar4 + 1) {
      (psVar9->
      super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = (psVar4->
               super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      (psVar9->
      super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2 = (psVar4->
               super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      (psVar4->
      super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (psVar9->
      super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = p_Var2;
      (psVar4->
      super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = (element_type *)0x0;
      psVar9 = psVar9 + 1;
    }
    if (psVar1 != (pointer)0x0) {
      operator_delete(psVar1);
    }
    (__return_storage_ptr__->conditions_).
    super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar6;
    (__return_storage_ptr__->conditions_).
    super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar9 + 1;
    (__return_storage_ptr__->conditions_).
    super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar6 + (long)this_00;
  }
  else {
    (psVar7->
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
    _M_ptr = local_48.
             super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (psVar7->
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48.
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (psVar7->
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = _Var3._M_pi;
    local_48.
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->conditions_).
    super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar7 + 1;
  }
  if (local_48.
      super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_38._M_head_impl != (QueryCondition *)0x0) {
    (*(local_38._M_head_impl)->_vptr_QueryCondition[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

QCGroup copyThisAndPush(const QueryCondition& other) {
        QCGroup copy(*this);
        copy.conditions_.push_back(internalCopyAsPtr(other));
        return copy;
    }